

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_text_proto.h
# Opt level: O0

FileDescriptorSet * __thiscall
upb_test::ParseTextProtoOrDie::operator_cast_to_FileDescriptorSet
          (FileDescriptorSet *__return_storage_ptr__,ParseTextProtoOrDie *this)

{
  bool bVar1;
  Message *pMVar2;
  string_view input;
  AssertHelper local_50;
  Message local_48 [3];
  undefined1 local_30 [16];
  undefined1 local_19;
  ParseTextProtoOrDie *local_18;
  ParseTextProtoOrDie *this_local;
  FileDescriptorSet *message;
  
  local_19 = 0;
  local_18 = this;
  this_local = (ParseTextProtoOrDie *)__return_storage_ptr__;
  google::protobuf::FileDescriptorSet::FileDescriptorSet(__return_storage_ptr__);
  local_30 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this);
  input._M_str = (char *)__return_storage_ptr__;
  input._M_len = local_30._8_8_;
  bVar1 = google::protobuf::TextFormat::ParseFromString
                    (local_30._0_8_,input,(Message *)local_30._0_8_);
  if (bVar1) {
    return __return_storage_ptr__;
  }
  testing::Message::Message(local_48);
  pMVar2 = testing::Message::operator<<(local_48,(char (*) [28])"Failed to parse textproto: ");
  pMVar2 = testing::Message::operator<<(pMVar2,&this->text_proto_);
  testing::internal::AssertHelper::AssertHelper
            (&local_50,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/test/parse_text_proto.h"
             ,0x20,"Failed");
  testing::internal::AssertHelper::operator=(&local_50,pMVar2);
  testing::internal::AssertHelper::~AssertHelper(&local_50);
  testing::Message::~Message(local_48);
  abort();
}

Assistant:

operator T() {  // NOLINT: Needed to support parsing text proto as appropriate
                  // type.
    T message;
    if (!google::protobuf::TextFormat::ParseFromString(text_proto_, &message)) {
      ADD_FAILURE() << "Failed to parse textproto: " << text_proto_;
      abort();
    }
    return message;
  }